

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void update_theta(saucy *s)

{
  int iVar1;
  int local_20;
  int tmp;
  int y;
  int x;
  int k;
  int i;
  saucy *s_local;
  
  for (x = 0; x < s->ndiffs; x = x + 1) {
    iVar1 = s->unsupp[x];
    tmp = find_representative(iVar1,s->theta);
    iVar1 = find_representative(s->gamma[iVar1],s->theta);
    if (tmp != iVar1) {
      local_20 = iVar1;
      if (iVar1 < tmp) {
        local_20 = tmp;
        tmp = iVar1;
      }
      s->theta[local_20] = tmp;
      s->thsize[tmp] = s->thsize[local_20] + s->thsize[tmp];
      s->thnext[s->thprev[local_20]] = s->thnext[local_20];
      s->thprev[s->thnext[local_20]] = s->thprev[local_20];
      s->threp[s->thfront[local_20]] = s->thnext[local_20];
    }
  }
  return;
}

Assistant:

static void
update_theta(struct saucy *s)
{
    int i, k, x, y, tmp;

    for (i = 0; i < s->ndiffs; ++i) {
        k = s->unsupp[i];
        x = find_representative(k, s->theta);
        y = find_representative(s->gamma[k], s->theta);

        if (x != y) {
            if (x > y) {
                tmp = x;
                x = y;
                y = tmp;
            }
            s->theta[y] = x;
            s->thsize[x] += s->thsize[y];

            s->thnext[s->thprev[y]] = s->thnext[y];
            s->thprev[s->thnext[y]] = s->thprev[y];
            s->threp[s->thfront[y]] = s->thnext[y];
        }
    }
}